

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaSubstGroupPtr xmlSchemaSubstGroupAdd(xmlSchemaParserCtxtPtr pctxt,xmlSchemaElementPtr head)

{
  int iVar1;
  xmlHashTablePtr pxVar2;
  xmlSchemaItemListPtr pxVar3;
  xmlSchemaSubstGroupPtr ret;
  xmlSchemaElementPtr head_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  if (pctxt->constructor->substGroups == (xmlHashTablePtr)0x0) {
    pxVar2 = xmlHashCreateDict(10,pctxt->dict);
    pctxt->constructor->substGroups = pxVar2;
    if (pctxt->constructor->substGroups == (xmlHashTablePtr)0x0) {
      return (xmlSchemaSubstGroupPtr)0x0;
    }
  }
  pctxt_local = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x10);
  if (pctxt_local == (xmlSchemaParserCtxtPtr)0x0) {
    xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0,"allocating a substitution group container",
                        (xmlNodePtr)0x0);
    pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    memset(pctxt_local,0,0x10);
    *(xmlSchemaElementPtr *)pctxt_local = head;
    pxVar3 = xmlSchemaItemListCreate();
    pctxt_local->errCtxt = pxVar3;
    if ((xmlSchemaItemListPtr)pctxt_local->errCtxt == (xmlSchemaItemListPtr)0x0) {
      xmlSchemaSubstGroupFree((xmlSchemaSubstGroupPtr)pctxt_local);
      pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      iVar1 = xmlHashAddEntry2(pctxt->constructor->substGroups,head->name,head->targetNamespace,
                               pctxt_local);
      if (iVar1 != 0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaSubstGroupAdd",
                   "failed to add a new substitution container");
        xmlSchemaSubstGroupFree((xmlSchemaSubstGroupPtr)pctxt_local);
        pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
      }
    }
  }
  return (xmlSchemaSubstGroupPtr)pctxt_local;
}

Assistant:

static xmlSchemaSubstGroupPtr
xmlSchemaSubstGroupAdd(xmlSchemaParserCtxtPtr pctxt,
		       xmlSchemaElementPtr head)
{
    xmlSchemaSubstGroupPtr ret;

    /* Init subst group hash. */
    if (WXS_SUBST_GROUPS(pctxt) == NULL) {
	WXS_SUBST_GROUPS(pctxt) = xmlHashCreateDict(10, pctxt->dict);
	if (WXS_SUBST_GROUPS(pctxt) == NULL)
	    return(NULL);
    }
    /* Create a new substitution group. */
    ret = (xmlSchemaSubstGroupPtr) xmlMalloc(sizeof(xmlSchemaSubstGroup));
    if (ret == NULL) {
	xmlSchemaPErrMemory(NULL,
	    "allocating a substitution group container", NULL);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaSubstGroup));
    ret->head = head;
    /* Create list of members. */
    ret->members = xmlSchemaItemListCreate();
    if (ret->members == NULL) {
	xmlSchemaSubstGroupFree(ret);
	return(NULL);
    }
    /* Add subst group to hash. */
    if (xmlHashAddEntry2(WXS_SUBST_GROUPS(pctxt),
	head->name, head->targetNamespace, ret) != 0) {
	PERROR_INT("xmlSchemaSubstGroupAdd",
	    "failed to add a new substitution container");
	xmlSchemaSubstGroupFree(ret);
	return(NULL);
    }
    return(ret);
}